

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::Pow::dim_forward
          (Dim *__return_storage_ptr__,Pow *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  uint uVar2;
  pointer pDVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  invalid_argument *this_00;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Dim r;
  string asStack_1b8 [32];
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined8 uStack_184;
  undefined8 local_17c;
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar3 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes-common.cc"
                  ,0x307,"virtual Dim cnn::Pow::dim_forward(const vector<Dim> &) const");
  }
  __return_storage_ptr__->bd = pDVar3->bd;
  uVar4 = *(undefined8 *)pDVar3->d;
  uVar5 = *(undefined8 *)(pDVar3->d + 2);
  uVar6 = *(undefined8 *)(pDVar3->d + 6);
  *(undefined8 *)(__return_storage_ptr__->d + 4) = *(undefined8 *)(pDVar3->d + 4);
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar6;
  *(undefined8 *)__return_storage_ptr__->d = uVar4;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar5;
  uVar2 = pDVar3->nd;
  uVar9 = 1;
  iVar7 = 1;
  if ((ulong)uVar2 != 0) {
    uVar11 = 0;
    do {
      iVar7 = iVar7 * pDVar3->d[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar2 != uVar11);
  }
  uVar8 = iVar7 * pDVar3->bd;
  if (1 < uVar8) {
    uVar11 = 1;
    uVar12 = 1;
    do {
      uVar9 = (uint)uVar12;
      if (uVar9 < uVar2) {
        uVar13 = (ulong)(uVar9 + 1);
        if (1 < pDVar3->d[uVar12]) {
          uVar11 = uVar13;
        }
      }
      else {
        uVar13 = (ulong)(uVar9 + 1);
      }
      uVar9 = (uint)uVar11;
      uVar12 = uVar13;
    } while ((uint)uVar13 < uVar8);
  }
  __return_storage_ptr__->nd = uVar9;
  pDVar1 = pDVar3 + 1;
  uVar2 = pDVar3[1].nd;
  iVar7 = 1;
  if ((ulong)uVar2 != 0) {
    uVar11 = 0;
    do {
      iVar7 = iVar7 * pDVar1->d[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar2 != uVar11);
  }
  uVar9 = iVar7 * pDVar3[1].bd;
  if (uVar9 < 2) {
    uStack_188 = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 3) >> 0x20);
    uStack_184 = *(undefined8 *)(pDVar3[1].d + 5);
    local_198 = *(undefined8 *)pDVar1->d;
    uStack_190 = (undefined4)*(undefined8 *)(pDVar3[1].d + 2);
    uStack_18c = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 2) >> 0x20);
    local_17c = 0x100000001;
    uVar8 = 1;
  }
  else {
    uVar10 = 1;
    uVar8 = 1;
    do {
      if ((uVar10 < uVar2) && (1 < pDVar1->d[uVar10])) {
        uVar8 = uVar10 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar9);
    uStack_188 = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 3) >> 0x20);
    uStack_184 = *(undefined8 *)(pDVar3[1].d + 5);
    local_198 = *(undefined8 *)pDVar1->d;
    uStack_190 = (undefined4)*(undefined8 *)(pDVar3[1].d + 2);
    uStack_18c = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 2) >> 0x20);
    local_17c = CONCAT44(1,uVar8);
    if (uVar8 == 0) {
      return __return_storage_ptr__;
    }
  }
  iVar7 = 1;
  uVar11 = 0;
  do {
    iVar7 = iVar7 * *(int *)((long)&local_198 + uVar11 * 4);
    uVar11 = uVar11 + 1;
  } while (uVar8 != uVar11);
  if (iVar7 == 1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Bad input dimensions in Pow: ",0x1d);
  operator<<((ostream *)&local_198,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}